

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * rbuMalloc(sqlite3rbu *p,sqlite3_int64 nByte)

{
  void *local_20;
  void *pRet;
  sqlite3_int64 nByte_local;
  sqlite3rbu *p_local;
  
  local_20 = (void *)0x0;
  if (p->rc == 0) {
    local_20 = sqlite3_malloc64(nByte);
    if (local_20 == (void *)0x0) {
      p->rc = 7;
    }
    else {
      memset(local_20,0,nByte);
    }
  }
  return local_20;
}

Assistant:

static void *rbuMalloc(sqlite3rbu *p, sqlite3_int64 nByte){
  void *pRet = 0;
  if( p->rc==SQLITE_OK ){
    assert( nByte>0 );
    pRet = sqlite3_malloc64(nByte);
    if( pRet==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      memset(pRet, 0, nByte);
    }
  }
  return pRet;
}